

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

Utf8SourceInfo *
Js::Utf8SourceInfo::NewWithHolder
          (ScriptContext *scriptContext,ISourceHolder *sourceHolder,int32 length,SRCINFO *srcInfo,
          bool isLibraryCode,Var scriptSource)

{
  int32 cchLength;
  ISourceHolder *mappableSource;
  bool bVar1;
  int iVar2;
  SourceContextInfo *this;
  ThreadContext *this_00;
  DebugManager *this_01;
  Recycler *pRVar3;
  Utf8SourceInfo *this_02;
  SRCINFO *srcInfo_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uchar **ppuVar4;
  byte local_b1;
  TrackAllocData local_78;
  Utf8SourceInfo *local_50;
  Utf8SourceInfo *toReturn;
  Recycler *recycler;
  DWORD_PTR secondaryHostSourceContext;
  Var scriptSource_local;
  SRCINFO *pSStack_28;
  bool isLibraryCode_local;
  SRCINFO *srcInfo_local;
  ISourceHolder *pIStack_18;
  int32 length_local;
  ISourceHolder *sourceHolder_local;
  ScriptContext *scriptContext_local;
  
  recycler = (Recycler *)&DAT_ffffffffffffffff;
  secondaryHostSourceContext = (DWORD_PTR)scriptSource;
  scriptSource_local._7_1_ = isLibraryCode;
  pSStack_28 = srcInfo;
  srcInfo_local._4_4_ = length;
  pIStack_18 = sourceHolder;
  sourceHolder_local = (ISourceHolder *)scriptContext;
  this = Memory::WriteBarrierPtr<SourceContextInfo>::operator->(&srcInfo->sourceContextInfo);
  bVar1 = SourceContextInfo::IsDynamic(this);
  if (bVar1) {
    this_00 = ScriptContext::GetThreadContext((ScriptContext *)sourceHolder_local);
    this_01 = ThreadContext::GetDebugManager(this_00);
    recycler = (Recycler *)DebugManager::AllocateSecondaryHostSourceContext(this_01);
  }
  pRVar3 = ScriptContext::GetRecycler((ScriptContext *)sourceHolder_local);
  toReturn = (Utf8SourceInfo *)pRVar3;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_78,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
             ,0xd0);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_78);
  this_02 = (Utf8SourceInfo *)new<Memory::Recycler>(0xc0,pRVar3,0x4642b0);
  mappableSource = pIStack_18;
  cchLength = srcInfo_local._4_4_;
  srcInfo_00 = SRCINFO::Copy((Recycler *)toReturn,pSStack_28);
  Utf8SourceInfo(this_02,mappableSource,cchLength,srcInfo_00,(DWORD_PTR)recycler,
                 (ScriptContext *)sourceHolder_local,(bool)(scriptSource_local._7_1_ & 1),
                 (Var)secondaryHostSourceContext);
  local_50 = this_02;
  if (((scriptSource_local._7_1_ & 1) == 0) &&
     (bVar1 = ScriptContext::IsScriptContextInDebugMode((ScriptContext *)sourceHolder_local), bVar1)
     ) {
    iVar2 = (*(pIStack_18->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[6])(pIStack_18,L"Debug Mode Loading");
    Memory::WriteBarrierPtr<const_unsigned_char>::operator=
              (&local_50->debugModeSource,(uchar *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*(pIStack_18->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(pIStack_18,L"Debug Mode Loading");
    local_50->debugModeSourceLength = CONCAT44(extraout_var_00,iVar2);
    ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&local_50->debugModeSource);
    local_b1 = 1;
    if (*ppuVar4 != (uchar *)0x0) {
      iVar2 = (*(pIStack_18->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[10])();
      local_b1 = (byte)iVar2;
    }
    local_50->field_0xa8 = local_50->field_0xa8 & 0xdf | (local_b1 & 1) << 5;
  }
  return local_50;
}

Assistant:

Utf8SourceInfo*
    Utf8SourceInfo::NewWithHolder(ScriptContext* scriptContext, ISourceHolder* sourceHolder,
        int32 length, SRCINFO const* srcInfo, bool isLibraryCode, Js::Var scriptSource)
    {
        // TODO: make this finalizable? Or have a finalizable version which would HeapDelete the string? Is this needed?
        DWORD_PTR secondaryHostSourceContext = Js::Constants::NoHostSourceContext;
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (srcInfo->sourceContextInfo->IsDynamic())
        {
            secondaryHostSourceContext = scriptContext->GetThreadContext()->GetDebugManager()->AllocateSecondaryHostSourceContext();
        }
#endif

        Recycler * recycler = scriptContext->GetRecycler();

        Utf8SourceInfo* toReturn = RecyclerNewFinalized(recycler,
            Utf8SourceInfo, sourceHolder, length, SRCINFO::Copy(recycler, srcInfo),
            secondaryHostSourceContext, scriptContext, isLibraryCode, scriptSource);

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (!isLibraryCode && scriptContext->IsScriptContextInDebugMode())
        {
            toReturn->debugModeSource = sourceHolder->GetSource(_u("Debug Mode Loading"));
            toReturn->debugModeSourceLength = sourceHolder->GetByteLength(_u("Debug Mode Loading"));
            toReturn->debugModeSourceIsEmpty = toReturn->debugModeSource == nullptr || sourceHolder->IsEmpty();
        }
#endif

        return toReturn;
    }